

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

Promise<unsigned_long> __thiscall
kj::anon_unknown_77::AsyncPipe::BlockedPumpFrom::pumpTo
          (BlockedPumpFrom *this,AsyncOutputStream *output,uint64_t amount2)

{
  TransformPromiseNodeBase *this_00;
  PromiseNode *in_RCX;
  AdapterPromiseNode<unsigned_long,_kj::Canceler::AdapterImpl<unsigned_long>_> *pAVar1;
  AdapterPromiseNode<unsigned_long,_kj::Canceler::AdapterImpl<unsigned_long>_> *extraout_RDX;
  AdapterPromiseNode<unsigned_long,_kj::Canceler::AdapterImpl<unsigned_long>_> *extraout_RDX_00;
  PromiseNode *pPVar2;
  Own<kj::_::ChainPromiseNode> OVar3;
  Own<kj::_::AdapterPromiseNode<unsigned_long,_kj::Canceler::AdapterImpl<unsigned_long>_>_> OVar4;
  Promise<unsigned_long> PVar5;
  Fault f;
  Promise<unsigned_long> local_78;
  Own<kj::_::PromiseNode> local_68;
  Own<kj::_::PromiseNode> local_58;
  Fault local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  if (output[7]._vptr_AsyncOutputStream == (_func_int **)0x0) {
    pPVar2 = (PromiseNode *)
             ((long)output[5]._vptr_AsyncOutputStream - (long)output[6]._vptr_AsyncOutputStream);
    if (in_RCX < pPVar2) {
      pPVar2 = in_RCX;
    }
    (**(code **)(*output[4]._vptr_AsyncOutputStream + 0x18))
              (&local_68,output[4]._vptr_AsyncOutputStream,amount2,pPVar2);
    this_00 = (TransformPromiseNodeBase *)operator_new(0x48);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_68,
               kj::_::
               TransformPromiseNode<kj::Promise<unsigned_long>,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:531:17),_kj::_::PropagateException>
               ::anon_class_32_4_39723cd8_for_func::operator());
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0062b018;
    this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)output;
    this_00[1].dependency.disposer = (Disposer *)amount2;
    this_00[1].dependency.ptr = in_RCX;
    this_00[1].continuationTracePtr = pPVar2;
    local_58.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<unsigned_long>,unsigned_long,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpFrom::pumpTo(kj::AsyncOutputStream&,unsigned_long)::{lambda(unsigned_long)#1},kj::_::PropagateException>>
          ::instance;
    local_58.ptr = (PromiseNode *)this_00;
    OVar3 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_48,&local_58);
    pPVar2 = local_58.ptr;
    local_78.super_PromiseBase.node.disposer._0_4_ = local_48.exception._0_4_;
    local_78.super_PromiseBase.node.disposer._4_4_ = local_48.exception._4_4_;
    local_78.super_PromiseBase.node.ptr = (PromiseNode *)CONCAT44(uStack_3c,uStack_40);
    if ((TransformPromiseNodeBase *)local_58.ptr != (TransformPromiseNodeBase *)0x0) {
      local_58.ptr = (PromiseNode *)0x0;
      (**(local_58.disposer)->_vptr_Disposer)
                (local_58.disposer,
                 ((PromiseNode *)&pPVar2->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pPVar2->_vptr_PromiseNode)->_vptr_PromiseNode,OVar3.ptr);
    }
    OVar4 = heap<kj::_::AdapterPromiseNode<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>>,kj::Canceler&,kj::Promise<unsigned_long>>
                      ((kj *)&local_48,(Canceler *)(output + 7),&local_78);
    pPVar2 = local_78.super_PromiseBase.node.ptr;
    pAVar1 = OVar4.ptr;
    *(undefined4 *)&(this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream =
         local_48.exception._0_4_;
    *(undefined4 *)
     ((long)&(this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream + 4) =
         local_48.exception._4_4_;
    *(undefined4 *)&(this->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream =
         uStack_40;
    *(undefined4 *)
     ((long)&(this->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream + 4) =
         uStack_3c;
    if (local_78.super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
      local_78.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (*(code *)**(undefined8 **)
                  CONCAT44(local_78.super_PromiseBase.node.disposer._4_4_,
                           local_78.super_PromiseBase.node.disposer._0_4_))
                ((undefined8 *)
                 CONCAT44(local_78.super_PromiseBase.node.disposer._4_4_,
                          local_78.super_PromiseBase.node.disposer._0_4_),
                 pPVar2->_vptr_PromiseNode[-2] + (long)&pPVar2->_vptr_PromiseNode);
      pAVar1 = extraout_RDX;
    }
    pPVar2 = local_68.ptr;
    if (local_68.ptr != (PromiseNode *)0x0) {
      local_68.ptr = (PromiseNode *)0x0;
      (**(local_68.disposer)->_vptr_Disposer)
                (local_68.disposer,pPVar2->_vptr_PromiseNode[-2] + (long)&pPVar2->_vptr_PromiseNode)
      ;
      pAVar1 = extraout_RDX_00;
    }
    PVar5.super_PromiseBase.node.ptr = (PromiseNode *)pAVar1;
    PVar5.super_PromiseBase.node.disposer = (Disposer *)this;
    return (Promise<unsigned_long>)PVar5.super_PromiseBase.node;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[16]>
            (&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
             ,0x20f,FAILED,"canceler.isEmpty()","\"already pumping\"",
             (char (*) [16])"already pumping");
  kj::_::Debug::Fault::fatal(&local_48);
}

Assistant:

KJ_IF_MAYBE(reason, stoppage) {
        if (reason->is<Eof>()) {
          return uint64_t(0);
        }
        return cp(reason->get<Exception>());
      }